

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  undefined7 in_register_00000031;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 local_20;
  float fStack_18;
  float fStack_14;
  
  fVar3 = cr_min.y;
  fVar4 = cr_max.x;
  fVar5 = cr_max.y;
  fVar6 = fVar5;
  local_20 = cr_min;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) {
    fVar6 = (this->_CmdHeader).ClipRect.x;
    fVar1 = (this->_CmdHeader).ClipRect.y;
    if (cr_min.x < fVar6) {
      local_20.y = fVar3;
      local_20.x = fVar6;
      cr_min.y = 0.0;
      cr_min.x = fVar6;
    }
    fVar7 = (this->_CmdHeader).ClipRect.z;
    fVar6 = (this->_CmdHeader).ClipRect.w;
    if (fVar3 < fVar1) {
      local_20.y = fVar1;
      fVar3 = fVar1;
    }
    if (fVar4 <= fVar7) {
      fVar7 = fVar4;
    }
    fVar4 = fVar7;
    if (fVar5 <= fVar6) {
      fVar6 = fVar5;
    }
  }
  uVar2 = -(uint)(fVar4 <= cr_min.x);
  fStack_18 = (float)(~uVar2 & (uint)fVar4 | (uint)cr_min.x & uVar2);
  fStack_14 = (float)(~-(uint)(fVar6 <= fVar3) & (uint)fVar6 | (uint)fVar3 & -(uint)(fVar6 <= fVar3)
                     );
  ImVector<ImVec4>::push_back(&this->_ClipRectStack,(ImVec4 *)&local_20);
  (this->_CmdHeader).ClipRect.x = local_20.x;
  (this->_CmdHeader).ClipRect.y = local_20.y;
  (this->_CmdHeader).ClipRect.z = fStack_18;
  (this->_CmdHeader).ClipRect.w = fStack_14;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}